

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

bool activeModifiedUpperBounds
               (HighsOptions *options,HighsLp *lp,vector<double,_std::allocator<double>_> *col_value
               )

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  piVar3 = (lp->mods_).save_tightened_semi_variable_upper_bound_index.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(lp->mods_).save_tightened_semi_variable_upper_bound_index.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
  if ((int)uVar4 < 1) {
    dVar7 = INFINITY;
  }
  else {
    dVar7 = INFINITY;
    uVar6 = 0;
    iVar5 = 0;
    do {
      iVar2 = piVar3[uVar6];
      dVar1 = (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      dVar8 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      if (dVar1 <= dVar8 - (options->super_HighsOptionsStruct).primal_feasibility_tolerance) {
        dVar8 = dVar8 - dVar1;
        if (dVar8 <= dVar7) {
          dVar7 = dVar8;
        }
      }
      else {
        iVar5 = iVar5 + 1;
        dVar7 = 0.0;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar6);
    if (iVar5 != 0) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,
                   "%d semi-variables are active at modified upper bounds\n");
      return true;
    }
  }
  if (uVar4 != 0) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                 "No semi-variables are active at modified upper bounds: a large minimum margin (%g) suggests optimality, but there is no guarantee\n"
                 ,dVar7);
  }
  return false;
}

Assistant:

bool activeModifiedUpperBounds(const HighsOptions& options, const HighsLp& lp,
                               const std::vector<double> col_value) {
  const std::vector<HighsInt>& tightened_semi_variable_upper_bound_index =
      lp.mods_.save_tightened_semi_variable_upper_bound_index;
  const HighsInt num_tightened_upper =
      tightened_semi_variable_upper_bound_index.size();
  HighsInt num_active_modified_upper = 0;
  double min_semi_variable_margin = kHighsInf;
  for (HighsInt k = 0; k < num_tightened_upper; k++) {
    const double value =
        col_value[tightened_semi_variable_upper_bound_index[k]];
    const double upper =
        lp.col_upper_[tightened_semi_variable_upper_bound_index[k]];
    double semi_variable_margin = upper - value;
    if (value > upper - options.primal_feasibility_tolerance) {
      min_semi_variable_margin = 0;
      num_active_modified_upper++;
    } else {
      min_semi_variable_margin =
          std::min(semi_variable_margin, min_semi_variable_margin);
    }
  }
  if (num_active_modified_upper) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "%" HIGHSINT_FORMAT
                 " semi-variables are active at modified upper bounds\n",
                 num_active_modified_upper);
  } else if (num_tightened_upper) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "No semi-variables are active at modified upper bounds:"
                 " a large minimum margin (%g) suggests optimality,"
                 " but there is no guarantee\n",
                 min_semi_variable_margin);
  }
  return (num_active_modified_upper != 0);
}